

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGla.c
# Opt level: O0

void Ga2_GlaPrepareCexAndMap(Ga2_Man_t *p,Abc_Cex_t **ppCex,Vec_Int_t **pvMaps)

{
  Gia_Man_t *pGVar1;
  int iVar2;
  Vec_Int_t *p_00;
  Abc_Cex_t *pAVar3;
  bool bVar4;
  int local_44;
  int local_40;
  int k;
  int i;
  int f;
  Gia_Obj_t *pObj;
  Vec_Int_t *vMap;
  Abc_Cex_t *pCex;
  Vec_Int_t **pvMaps_local;
  Abc_Cex_t **ppCex_local;
  Ga2_Man_t *p_local;
  
  p_00 = Vec_IntAlloc(1000);
  local_40 = 0;
  do {
    iVar2 = Vec_IntSize(p->vValues);
    bVar4 = false;
    if (local_40 < iVar2) {
      pGVar1 = p->pGia;
      iVar2 = Vec_IntEntry(p->vValues,local_40);
      _i = Gia_ManObj(pGVar1,iVar2);
      bVar4 = _i != (Gia_Obj_t *)0x0;
    }
    if (!bVar4) {
      iVar2 = Vec_IntSize(p_00);
      pAVar3 = Abc_CexAlloc(0,iVar2,p->pPars->iFrame + 1);
      pAVar3->iFrame = p->pPars->iFrame;
      for (k = 0; k <= p->pPars->iFrame; k = k + 1) {
        local_44 = 0;
        while( true ) {
          iVar2 = Vec_IntSize(p_00);
          bVar4 = false;
          if (local_44 < iVar2) {
            pGVar1 = p->pGia;
            iVar2 = Vec_IntEntry(p_00,local_44);
            _i = Gia_ManObj(pGVar1,iVar2);
            bVar4 = _i != (Gia_Obj_t *)0x0;
          }
          if (!bVar4) break;
          iVar2 = Ga2_ObjSatValue(p,_i,k);
          if (iVar2 != 0) {
            iVar2 = Vec_IntSize(p_00);
            Abc_InfoSetBit((uint *)(pAVar3 + 1),k * iVar2 + local_44);
          }
          local_44 = local_44 + 1;
        }
      }
      *pvMaps = p_00;
      *ppCex = pAVar3;
      return;
    }
    if ((local_40 != 0) && (iVar2 = Ga2_ObjIsAbs(p,_i), iVar2 == 0)) {
      if (-1 < *(long *)_i) {
        __assert_fail("pObj->fPhase",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGla.c"
                      ,0x4f1,"void Ga2_GlaPrepareCexAndMap(Ga2_Man_t *, Abc_Cex_t **, Vec_Int_t **)"
                     );
      }
      iVar2 = Ga2_ObjIsLeaf(p,_i);
      if (iVar2 == 0) {
        __assert_fail("Ga2_ObjIsLeaf(p, pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGla.c"
                      ,0x4f2,"void Ga2_GlaPrepareCexAndMap(Ga2_Man_t *, Abc_Cex_t **, Vec_Int_t **)"
                     );
      }
      iVar2 = Gia_ObjIsAnd(_i);
      if ((iVar2 == 0) && (iVar2 = Gia_ObjIsCi(_i), iVar2 == 0)) {
        __assert_fail("Gia_ObjIsAnd(pObj) || Gia_ObjIsCi(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGla.c"
                      ,0x4f3,"void Ga2_GlaPrepareCexAndMap(Ga2_Man_t *, Abc_Cex_t **, Vec_Int_t **)"
                     );
      }
      iVar2 = Gia_ObjId(p->pGia,_i);
      Vec_IntPush(p_00,iVar2);
    }
    local_40 = local_40 + 1;
  } while( true );
}

Assistant:

void Ga2_GlaPrepareCexAndMap( Ga2_Man_t * p, Abc_Cex_t ** ppCex, Vec_Int_t ** pvMaps )
{
    Abc_Cex_t * pCex;
    Vec_Int_t * vMap;
    Gia_Obj_t * pObj;
    int f, i, k;
/*
    Gia_ManForEachObj( p->pGia, pObj, i )
        if ( Ga2_ObjId(p, pObj) >= 0 )
            assert( Vec_IntEntry(p->vValues, Ga2_ObjId(p, pObj)) == i );
*/
    // find PIs and PPIs
    vMap = Vec_IntAlloc( 1000 );
    Gia_ManForEachObjVec( p->vValues, p->pGia, pObj, i )
    {
        if ( !i ) continue;
        if ( Ga2_ObjIsAbs(p, pObj) )
            continue;
        assert( pObj->fPhase );
        assert( Ga2_ObjIsLeaf(p, pObj) );
        assert( Gia_ObjIsAnd(pObj) || Gia_ObjIsCi(pObj) );
        Vec_IntPush( vMap, Gia_ObjId(p->pGia, pObj) );
    }
    // derive counter-example
    pCex = Abc_CexAlloc( 0, Vec_IntSize(vMap), p->pPars->iFrame+1 );
    pCex->iFrame = p->pPars->iFrame;
    for ( f = 0; f <= p->pPars->iFrame; f++ )
        Gia_ManForEachObjVec( vMap, p->pGia, pObj, k )
            if ( Ga2_ObjSatValue( p, pObj, f ) )
                Abc_InfoSetBit( pCex->pData, f * Vec_IntSize(vMap) + k );
    *pvMaps = vMap;
    *ppCex = pCex;
}